

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O1

Packet * __thiscall mognetwork::Packet::operator<<(Packet *this,uint32_t data)

{
  vector<char,_std::allocator<char>_> *this_00;
  ulong uVar1;
  
  this_00 = this->m_data;
  uVar1 = (long)(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize(this_00,(ulong)((int)uVar1 + 4),'\0');
  *(uint32_t *)
   ((this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start + (uVar1 & 0xffffffff)) =
       data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
  return this;
}

Assistant:

Packet& Packet::operator<<(uint32_t data)
  {
    uint32_t write = htonl(data);
    push(&write, sizeof(write));
    return (*this);
  }